

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlFloat.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlFloat::ReadData(EbmlFloat *this,IOCallback *input,ScopeMode ReadFully)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  double dVar2;
  binary Buffer [20];
  big_int32 TmpRead;
  
  if (ReadFully != SCOPE_NO_DATA) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (0x14 < CONCAT44(extraout_var,iVar1)) {
      __assert_fail("GetSize() <= 20",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlFloat.cpp"
                    ,0x7c,"virtual filepos_t libebml::EbmlFloat::ReadData(IOCallback &, ScopeMode)")
      ;
    }
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::readFully(input,Buffer,CONCAT44(extraout_var_00,iVar1));
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_01,iVar1) == 4) {
      TmpRead.endian_value._0_1_ = Buffer[0];
      TmpRead.endian_value._1_1_ = Buffer[1];
      TmpRead.endian_value._2_1_ = Buffer[2];
      TmpRead.endian_value._3_1_ = Buffer[3];
      Endian<int,_(libebml::endianess)0>::process_platform(&TmpRead);
      dVar2 = (double)(float)TmpRead.platform_value;
    }
    else {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
      if (CONCAT44(extraout_var_02,iVar1) != 8) goto LAB_001910aa;
      Endian<long,_(libebml::endianess)0>::process_platform
                ((Endian<long,_(libebml::endianess)0> *)&TmpRead);
      dVar2 = (double)CONCAT44(TmpRead.endian_value,TmpRead.platform_value);
    }
    this->Value = dVar2;
    (this->super_EbmlElement).bValueIsSet = true;
  }
LAB_001910aa:
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_03,iVar1);
}

Assistant:

filepos_t EbmlFloat::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary Buffer[20];
    assert(GetSize() <= 20);
    input.readFully(Buffer, GetSize());

    if (GetSize() == 4) {
      big_int32 TmpRead;
      TmpRead.Eval(Buffer);
      int32 tmpp = int32(TmpRead);
      float val;
      memcpy(&val, &tmpp, 4);
      Value = val;
      SetValueIsSet();
    } else if (GetSize() == 8) {
      big_int64 TmpRead;
      TmpRead.Eval(Buffer);
      int64 tmpp = int64(TmpRead);
      double val;
      memcpy(&val, &tmpp, 8);
      Value = val;
      SetValueIsSet();
    }
  }

  return GetSize();
}